

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeGetNumNonlinSolvIters(void *arkode_mem,long *nniters)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xb4d,"ARKodeGetNumNonlinSolvIters",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (*(code **)((long)arkode_mem + 0x1e8) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x1e8))();
      return iVar1;
    }
    *nniters = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumNonlinSolvIters(void* arkode_mem, long int* nniters)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper routine to compute the state (if provided) */
  if (ark_mem->step_getnumnonlinsolviters)
  {
    return (ark_mem->step_getnumnonlinsolviters(ark_mem, nniters));
  }
  else
  {
    *nniters = 0;
    return (ARK_SUCCESS);
  }
}